

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O1

ma_fader_config ma_fader_config_init(ma_format format,ma_uint32 channels,ma_uint32 sampleRate)

{
  ma_fader_config mVar1;
  
  mVar1.channels = channels;
  mVar1.format = format;
  mVar1.sampleRate = sampleRate;
  return mVar1;
}

Assistant:

MA_API ma_fader_config ma_fader_config_init(ma_format format, ma_uint32 channels, ma_uint32 sampleRate)
{
    ma_fader_config config;

    MA_ZERO_OBJECT(&config);
    config.format     = format;
    config.channels   = channels;
    config.sampleRate = sampleRate;

    return config;
}